

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall inject::no_binding::~no_binding(no_binding *this)

{
  no_binding *this_local;
  
  ~no_binding(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~no_binding() throw() { }